

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::anon_unknown_61::ValidateBlendStateDesc
               (PipelineStateDesc *PSODesc,GraphicsPipelineDesc *GraphicsPipeline)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  bool local_b3;
  bool local_b2;
  bool local_b1;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  bool local_49;
  RenderTargetBlendDesc *pRStack_48;
  bool BlendEnable;
  RenderTargetBlendDesc *RTDesc;
  GraphicsPipelineDesc *pGStack_38;
  Uint32 rt;
  BlendStateDesc *BlendDesc;
  GraphicsPipelineDesc *GraphicsPipeline_local;
  PipelineStateDesc *PSODesc_local;
  
  RTDesc._4_4_ = 0;
  pGStack_38 = GraphicsPipeline;
  BlendDesc = &GraphicsPipeline->BlendDesc;
  GraphicsPipeline_local = (GraphicsPipelineDesc *)PSODesc;
  for (; RTDesc._4_4_ < 8; RTDesc._4_4_ = RTDesc._4_4_ + 1) {
    pRStack_48 = (pGStack_38->BlendDesc).RenderTargets + RTDesc._4_4_;
    local_b1 = false;
    if ((pRStack_48->BlendEnable & 1U) != 0) {
      local_b2 = true;
      if (RTDesc._4_4_ != 0) {
        local_b3 = ((pGStack_38->BlendDesc).IndependentBlendEnable & 1U) != 0 && RTDesc._4_4_ != 0;
        local_b2 = local_b3;
      }
      local_b1 = local_b2;
    }
    local_49 = local_b1;
    if (local_b1 != false) {
      if (pRStack_48->SrcBlend == BLEND_FACTOR_UNDEFINED) {
        local_58 = GetPipelineTypeString
                             ((GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlendAlpha);
        lVar1._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
        lVar1._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
        lVar1._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
        lVar1._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
        lVar1._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
        lVar1._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
        lVar1._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
        lVar1._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
        if (lVar1 == 0) {
          local_c0 = "";
        }
        else {
          local_c0 = *(char **)&GraphicsPipeline_local->BlendDesc;
        }
        local_60 = local_c0;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[47]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x96,(char (*) [16])"Description of ",&local_58,(char (*) [7])0x45b448,&local_60
                   ,(char (*) [15])"\' is invalid: ",(char (*) [25])"BlendDesc.RenderTargets[",
                   (uint *)((long)&RTDesc + 4),
                   (char (*) [47])"].SrcBlend must not be BLEND_FACTOR_UNDEFINED.");
      }
      if (pRStack_48->DestBlend == BLEND_FACTOR_UNDEFINED) {
        local_68 = GetPipelineTypeString
                             ((GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlendAlpha);
        lVar2._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
        lVar2._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
        lVar2._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
        lVar2._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
        lVar2._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
        lVar2._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
        lVar2._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
        lVar2._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
        if (lVar2 == 0) {
          local_c8 = "";
        }
        else {
          local_c8 = *(char **)&GraphicsPipeline_local->BlendDesc;
        }
        local_70 = local_c8;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[48]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x98,(char (*) [16])"Description of ",&local_68,(char (*) [7])0x45b448,&local_70
                   ,(char (*) [15])"\' is invalid: ",(char (*) [25])"BlendDesc.RenderTargets[",
                   (uint *)((long)&RTDesc + 4),
                   (char (*) [48])"].DestBlend must not be BLEND_FACTOR_UNDEFINED.");
      }
      if (pRStack_48->BlendOp == BLEND_OPERATION_UNDEFINED) {
        local_78 = GetPipelineTypeString
                             ((GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlendAlpha);
        lVar3._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
        lVar3._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
        lVar3._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
        lVar3._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
        lVar3._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
        lVar3._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
        lVar3._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
        lVar3._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
        if (lVar3 == 0) {
          local_d0 = "";
        }
        else {
          local_d0 = *(char **)&GraphicsPipeline_local->BlendDesc;
        }
        local_80 = local_d0;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[49]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x9a,(char (*) [16])"Description of ",&local_78,(char (*) [7])0x45b448,&local_80
                   ,(char (*) [15])"\' is invalid: ",(char (*) [25])"BlendDesc.RenderTargets[",
                   (uint *)((long)&RTDesc + 4),
                   (char (*) [49])"].BlendOp must not be BLEND_OPERATION_UNDEFINED.");
      }
      if (pRStack_48->SrcBlendAlpha == BLEND_FACTOR_UNDEFINED) {
        local_88 = GetPipelineTypeString
                             ((GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlendAlpha);
        lVar4._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
        lVar4._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
        lVar4._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
        lVar4._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
        lVar4._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
        lVar4._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
        lVar4._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
        lVar4._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
        if (lVar4 == 0) {
          local_d8 = "";
        }
        else {
          local_d8 = *(char **)&GraphicsPipeline_local->BlendDesc;
        }
        local_90 = local_d8;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[52]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x9d,(char (*) [16])"Description of ",&local_88,(char (*) [7])0x45b448,&local_90
                   ,(char (*) [15])"\' is invalid: ",(char (*) [25])"BlendDesc.RenderTargets[",
                   (uint *)((long)&RTDesc + 4),
                   (char (*) [52])"].SrcBlendAlpha must not be BLEND_FACTOR_UNDEFINED.");
      }
      if (pRStack_48->DestBlendAlpha == BLEND_FACTOR_UNDEFINED) {
        local_98 = GetPipelineTypeString
                             ((GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlendAlpha);
        lVar5._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
        lVar5._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
        lVar5._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
        lVar5._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
        lVar5._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
        lVar5._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
        lVar5._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
        lVar5._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
        if (lVar5 == 0) {
          local_e0 = "";
        }
        else {
          local_e0 = *(char **)&GraphicsPipeline_local->BlendDesc;
        }
        local_a0 = local_e0;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[53]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x9f,(char (*) [16])"Description of ",&local_98,(char (*) [7])0x45b448,&local_a0
                   ,(char (*) [15])"\' is invalid: ",(char (*) [25])"BlendDesc.RenderTargets[",
                   (uint *)((long)&RTDesc + 4),
                   (char (*) [53])"].DestBlendAlpha must not be BLEND_FACTOR_UNDEFINED.");
      }
      if (pRStack_48->BlendOpAlpha == BLEND_OPERATION_UNDEFINED) {
        local_a8 = GetPipelineTypeString
                             ((GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlendAlpha);
        lVar6._0_1_ = (GraphicsPipeline_local->BlendDesc).AlphaToCoverageEnable;
        lVar6._1_1_ = (GraphicsPipeline_local->BlendDesc).IndependentBlendEnable;
        lVar6._2_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendEnable;
        lVar6._3_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].LogicOperationEnable;
        lVar6._4_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlend;
        lVar6._5_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].DestBlend;
        lVar6._6_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].BlendOp;
        lVar6._7_1_ = (GraphicsPipeline_local->BlendDesc).RenderTargets[0].SrcBlendAlpha;
        if (lVar6 == 0) {
          local_e8 = "";
        }
        else {
          local_e8 = *(char **)&GraphicsPipeline_local->BlendDesc;
        }
        local_b0 = local_e8;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[54]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0xa1,(char (*) [16])"Description of ",&local_a8,(char (*) [7])0x45b448,&local_b0
                   ,(char (*) [15])"\' is invalid: ",(char (*) [25])"BlendDesc.RenderTargets[",
                   (uint *)((long)&RTDesc + 4),
                   (char (*) [54])"].BlendOpAlpha must not be BLEND_OPERATION_UNDEFINED.");
      }
    }
  }
  return;
}

Assistant:

void ValidateBlendStateDesc(const PipelineStateDesc& PSODesc, const GraphicsPipelineDesc& GraphicsPipeline) noexcept(false)
{
    const BlendStateDesc& BlendDesc = GraphicsPipeline.BlendDesc;
    for (Uint32 rt = 0; rt < MAX_RENDER_TARGETS; ++rt)
    {
        const RenderTargetBlendDesc& RTDesc = BlendDesc.RenderTargets[rt];

        const bool BlendEnable = RTDesc.BlendEnable && (rt == 0 || (BlendDesc.IndependentBlendEnable && rt > 0));
        if (BlendEnable)
        {
            if (RTDesc.SrcBlend == BLEND_FACTOR_UNDEFINED)
                LOG_PSO_ERROR_AND_THROW("BlendDesc.RenderTargets[", rt, "].SrcBlend must not be BLEND_FACTOR_UNDEFINED.");
            if (RTDesc.DestBlend == BLEND_FACTOR_UNDEFINED)
                LOG_PSO_ERROR_AND_THROW("BlendDesc.RenderTargets[", rt, "].DestBlend must not be BLEND_FACTOR_UNDEFINED.");
            if (RTDesc.BlendOp == BLEND_OPERATION_UNDEFINED)
                LOG_PSO_ERROR_AND_THROW("BlendDesc.RenderTargets[", rt, "].BlendOp must not be BLEND_OPERATION_UNDEFINED.");

            if (RTDesc.SrcBlendAlpha == BLEND_FACTOR_UNDEFINED)
                LOG_PSO_ERROR_AND_THROW("BlendDesc.RenderTargets[", rt, "].SrcBlendAlpha must not be BLEND_FACTOR_UNDEFINED.");
            if (RTDesc.DestBlendAlpha == BLEND_FACTOR_UNDEFINED)
                LOG_PSO_ERROR_AND_THROW("BlendDesc.RenderTargets[", rt, "].DestBlendAlpha must not be BLEND_FACTOR_UNDEFINED.");
            if (RTDesc.BlendOpAlpha == BLEND_OPERATION_UNDEFINED)
                LOG_PSO_ERROR_AND_THROW("BlendDesc.RenderTargets[", rt, "].BlendOpAlpha must not be BLEND_OPERATION_UNDEFINED.");
        }
    }
}